

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t systemf(char *fmt,...)

{
  char in_AL;
  wchar_t wVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_20f8 [8];
  undefined8 local_20f0;
  undefined8 local_20e8;
  undefined8 local_20e0;
  undefined8 local_20d8;
  undefined8 local_20d0;
  undefined8 local_20c8;
  undefined8 local_20b8;
  undefined8 local_20a8;
  undefined8 local_2098;
  undefined8 local_2088;
  undefined8 local_2078;
  undefined8 local_2068;
  undefined8 local_2058;
  undefined4 local_2038;
  wchar_t r;
  va_list ap;
  char local_2018 [8];
  char buff [8192];
  char *fmt_local;
  
  if (in_AL != '\0') {
    local_20c8 = in_XMM0_Qa;
    local_20b8 = in_XMM1_Qa;
    local_20a8 = in_XMM2_Qa;
    local_2098 = in_XMM3_Qa;
    local_2088 = in_XMM4_Qa;
    local_2078 = in_XMM5_Qa;
    local_2068 = in_XMM6_Qa;
    local_2058 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = local_20f8;
  ap[0]._0_8_ = &stack0x00000008;
  r = L'0';
  local_2038 = 8;
  local_20f0 = in_RSI;
  local_20e8 = in_RDX;
  local_20e0 = in_RCX;
  local_20d8 = in_R8;
  local_20d0 = in_R9;
  vsnprintf(local_2018,0x2000,fmt,&local_2038);
  if (L'\x02' < verbosity) {
    logprintf("Cmd: %s\n",local_2018);
  }
  wVar1 = system(local_2018);
  return wVar1;
}

Assistant:

int
systemf(const char *fmt, ...)
{
	char buff[8192];
	va_list ap;
	int r;

	va_start(ap, fmt);
	vsnprintf(buff, sizeof(buff), fmt, ap);
	if (verbosity > VERBOSITY_FULL)
		logprintf("Cmd: %s\n", buff);
	r = system(buff);
	va_end(ap);
	return (r);
}